

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_graph.h
# Opt level: O0

void __thiscall
Clasp::Asp::PrgDepGraph::visitBodyLiterals<Clasp::DefaultUnfoundedCheck::AddReasonLit>
          (PrgDepGraph *this,BodyNode *n,AddReasonLit *p)

{
  bool bVar1;
  uint32 uVar2;
  AtomNode *pAVar3;
  PrgDepGraph *in_RDX;
  BodyNode *in_RSI;
  AddReasonLit *in_RDI;
  uint32 i;
  uint32 inc;
  NodeId *x;
  undefined8 in_stack_ffffffffffffffb8;
  PrgDepGraph *in_stack_ffffffffffffffc0;
  Literal in_stack_ffffffffffffffd4;
  NodeId *local_20;
  
  local_20 = BodyNode::preds(in_RSI);
  uVar2 = BodyNode::pred_inc((BodyNode *)0x212fc6);
  for (; *local_20 != 0xffffffff; local_20 = local_20 + uVar2) {
    in_stack_ffffffffffffffc0 = in_RDX;
    pAVar3 = getAtom(in_RDX,(NodeId)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    in_stack_ffffffffffffffd4.rep_ = (pAVar3->super_Node).lit.rep_;
    DefaultUnfoundedCheck::AddReasonLit::operator()
              (in_RDI,in_stack_ffffffffffffffd4,(NodeId)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffffc0 >> 0x18,0));
  }
  bVar1 = BodyNode::extended(in_RSI);
  for (local_20 = local_20 + (int)(uint)bVar1; *local_20 != 0xffffffff; local_20 = local_20 + uVar2)
  {
    Literal::fromRep(0x213077);
    DefaultUnfoundedCheck::AddReasonLit::operator()
              (in_RDI,in_stack_ffffffffffffffd4,(NodeId)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffffc0 >> 0x18,0));
  }
  return;
}

Assistant:

void visitBodyLiterals(const BodyNode& n, const P& p) const {
		const NodeId*  x = n.preds();
		const uint32 inc = n.pred_inc();
		uint32         i = 0;
		for (; *x != idMax; x += inc, ++i) { p(getAtom(*x).lit, i, false); }
		x += n.extended();
		for (; *x != idMax; x += inc, ++i) { p(Literal::fromRep(*x), i, true); }
	}